

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb2Image.c
# Opt level: O3

DdManager * Llb_ImgPartition(Aig_Man_t *p,Vec_Ptr_t *vLower,Vec_Ptr_t *vUpper,abctime TimeTarget)

{
  void *pvVar1;
  DdManager *unique;
  DdNode *pDVar2;
  Vec_Ptr_t *__ptr;
  Vec_Ptr_t *__ptr_00;
  DdNode *n;
  DdNode *f;
  long lVar3;
  
  unique = Cudd_Init(p->vObjs->nSize,0,0x100,0x40000,0);
  Cudd_AutodynEnable(unique,CUDD_REORDER_SYMM_SIFT);
  unique->TimeStop = TimeTarget;
  if (0 < vLower->nSize) {
    lVar3 = 0;
    do {
      pvVar1 = vLower->pArray[lVar3];
      pDVar2 = Cudd_bddIthVar(unique,*(int *)((long)pvVar1 + 0x24));
      *(DdNode **)((long)pvVar1 + 0x28) = pDVar2;
      lVar3 = lVar3 + 1;
    } while (lVar3 < vLower->nSize);
  }
  __ptr = Llb_ManCutNodes(p,vLower,vUpper);
  if (0 < __ptr->nSize) {
    lVar3 = 0;
    do {
      pvVar1 = __ptr->pArray[lVar3];
      pDVar2 = Cudd_bddAnd(unique,(DdNode *)
                                  ((ulong)((uint)*(ulong *)((long)pvVar1 + 8) & 1) ^
                                  *(ulong *)((*(ulong *)((long)pvVar1 + 8) & 0xfffffffffffffffe) +
                                            0x28)),
                           (DdNode *)
                           ((ulong)((uint)*(ulong *)((long)pvVar1 + 0x10) & 1) ^
                           *(ulong *)((*(ulong *)((long)pvVar1 + 0x10) & 0xfffffffffffffffe) + 0x28)
                           ));
      *(DdNode **)((long)pvVar1 + 0x28) = pDVar2;
      if (pDVar2 == (DdNode *)0x0) {
        Cudd_Quit(unique);
        if (__ptr->pArray != (void **)0x0) {
          free(__ptr->pArray);
        }
        goto LAB_008411f9;
      }
      Cudd_Ref(pDVar2);
      lVar3 = lVar3 + 1;
    } while (lVar3 < __ptr->nSize);
  }
  __ptr_00 = Llb_ManCutRange(p,vLower,vUpper);
  pDVar2 = Cudd_ReadOne(unique);
  Cudd_Ref(pDVar2);
  if (0 < __ptr_00->nSize) {
    lVar3 = 0;
    f = pDVar2;
    do {
      pvVar1 = __ptr_00->pArray[lVar3];
      if ((*(uint *)((long)pvVar1 + 0x18) & 7) - 7 < 0xfffffffe) {
        __assert_fail("Aig_ObjIsNode(pObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bdd/llb/llb2Image.c"
                      ,0xdb,
                      "DdManager *Llb_ImgPartition(Aig_Man_t *, Vec_Ptr_t *, Vec_Ptr_t *, abctime)")
        ;
      }
      pDVar2 = Cudd_bddIthVar(unique,*(int *)((long)pvVar1 + 0x24));
      n = Cudd_bddXnor(unique,pDVar2,*(DdNode **)((long)pvVar1 + 0x28));
      Cudd_Ref(n);
      pDVar2 = Cudd_bddAnd(unique,f,n);
      if (pDVar2 == (DdNode *)0x0) {
        Cudd_Quit(unique);
        if (__ptr_00->pArray != (void **)0x0) {
          free(__ptr_00->pArray);
        }
        free(__ptr_00);
        if (__ptr->pArray != (void **)0x0) {
          free(__ptr->pArray);
        }
LAB_008411f9:
        free(__ptr);
        return (DdManager *)0x0;
      }
      Cudd_Ref(pDVar2);
      Cudd_RecursiveDeref(unique,f);
      Cudd_RecursiveDeref(unique,n);
      lVar3 = lVar3 + 1;
      f = pDVar2;
    } while (lVar3 < __ptr_00->nSize);
  }
  if (0 < __ptr->nSize) {
    lVar3 = 0;
    do {
      Cudd_RecursiveDeref(unique,*(DdNode **)((long)__ptr->pArray[lVar3] + 0x28));
      lVar3 = lVar3 + 1;
    } while (lVar3 < __ptr->nSize);
  }
  if (__ptr_00->pArray != (void **)0x0) {
    free(__ptr_00->pArray);
  }
  free(__ptr_00);
  if (__ptr->pArray != (void **)0x0) {
    free(__ptr->pArray);
  }
  free(__ptr);
  Cudd_AutodynDisable(unique);
  unique->bFunc = pDVar2;
  unique->TimeStop = 0;
  return unique;
}

Assistant:

DdManager * Llb_ImgPartition( Aig_Man_t * p, Vec_Ptr_t * vLower, Vec_Ptr_t * vUpper, abctime TimeTarget )
{
    Vec_Ptr_t * vNodes, * vRange;
    Aig_Obj_t * pObj;
    DdManager * dd;
    DdNode * bBdd0, * bBdd1, * bProd, * bRes, * bTemp;
    int i;

    dd = Cudd_Init( Aig_ManObjNumMax(p), 0, CUDD_UNIQUE_SLOTS, CUDD_CACHE_SLOTS, 0 );
    Cudd_AutodynEnable( dd,  CUDD_REORDER_SYMM_SIFT );
    dd->TimeStop = TimeTarget;

    Vec_PtrForEachEntry( Aig_Obj_t *, vLower, pObj, i )
        pObj->pData = Cudd_bddIthVar( dd, Aig_ObjId(pObj) );

    vNodes = Llb_ManCutNodes( p, vLower, vUpper );
    Vec_PtrForEachEntry( Aig_Obj_t *, vNodes, pObj, i )
    {
        bBdd0 = Cudd_NotCond( (DdNode *)Aig_ObjFanin0(pObj)->pData, Aig_ObjFaninC0(pObj) );
        bBdd1 = Cudd_NotCond( (DdNode *)Aig_ObjFanin1(pObj)->pData, Aig_ObjFaninC1(pObj) );
//        pObj->pData = Cudd_bddAnd( dd, bBdd0, bBdd1 );   Cudd_Ref( (DdNode *)pObj->pData );
//        pObj->pData = Extra_bddAndTime( dd, bBdd0, bBdd1, TimeTarget );  
        pObj->pData = Cudd_bddAnd( dd, bBdd0, bBdd1 );  
        if ( pObj->pData == NULL )
        {
            Cudd_Quit( dd );
            Vec_PtrFree( vNodes );
            return NULL;
        }
        Cudd_Ref( (DdNode *)pObj->pData );
    }

    vRange = Llb_ManCutRange( p, vLower, vUpper );
    bRes   = Cudd_ReadOne(dd);   Cudd_Ref( bRes );
    Vec_PtrForEachEntry( Aig_Obj_t *, vRange, pObj, i )
    {
        assert( Aig_ObjIsNode(pObj) );
        bProd = Cudd_bddXnor( dd, Cudd_bddIthVar(dd, Aig_ObjId(pObj)), (DdNode *)pObj->pData );   Cudd_Ref( bProd );
//        bRes  = Cudd_bddAnd( dd, bTemp = bRes, bProd ); Cudd_Ref( bRes );
//        bRes  = Extra_bddAndTime( dd, bTemp = bRes, bProd, TimeTarget );  
        bRes  = Cudd_bddAnd( dd, bTemp = bRes, bProd );  
        if ( bRes == NULL )
        {
            Cudd_Quit( dd );
            Vec_PtrFree( vRange );
            Vec_PtrFree( vNodes );
            return NULL;
        }        
        Cudd_Ref( bRes );
        Cudd_RecursiveDeref( dd, bTemp );
        Cudd_RecursiveDeref( dd, bProd );
    }
    Vec_PtrForEachEntry( Aig_Obj_t *, vNodes, pObj, i )
        Cudd_RecursiveDeref( dd, (DdNode *)pObj->pData );

    Vec_PtrFree( vRange );
    Vec_PtrFree( vNodes );
    Cudd_AutodynDisable( dd );
//    Cudd_RecursiveDeref( dd, bRes );
//    Extra_StopManager( dd );
    dd->bFunc = bRes;
    dd->TimeStop = 0;
    return dd;
}